

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_invoke(Executor *this,Worker *worker,Node *node)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  pointer pSVar4;
  uint *puVar5;
  size_t sVar6;
  Worker *pWVar7;
  int __c;
  uint *in_RDX;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_RSI;
  SmallVectorTemplateCommon<tf::Node_*,_void> *pSVar8;
  Executor *in_RDI;
  Node *s_1;
  size_t i;
  Node *s;
  int cond;
  iterator __end3;
  iterator __begin3;
  SmallVector<int,_2U> *__range3;
  atomic<unsigned_long> *join_counter;
  SmallVector<tf::Node_*,_2U> waiters_1;
  SmallVector<int,_2U> conds;
  SmallVector<tf::Node_*,_2U> waiters;
  Node *cache;
  memory_order __b;
  size_type in_stack_fffffffffffffd28;
  Executor *in_stack_fffffffffffffd30;
  Node *in_stack_fffffffffffffd40;
  Worker *in_stack_fffffffffffffd48;
  Executor *in_stack_fffffffffffffd50;
  Worker *in_stack_fffffffffffffd58;
  Executor *in_stack_fffffffffffffd60;
  Worker *in_stack_fffffffffffffd68;
  Worker *in_stack_fffffffffffffd70;
  Worker *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  Node *in_stack_fffffffffffffd88;
  Worker *in_stack_fffffffffffffd90;
  Worker *in_stack_fffffffffffffd98;
  Worker *local_260;
  Executor *pEVar9;
  Node *in_stack_fffffffffffffe20;
  Worker *in_stack_fffffffffffffe28;
  Executor *in_stack_fffffffffffffe30;
  Worker *local_1b8;
  SmallVectorTemplateCommon<tf::Node_*,_void> local_1a0;
  SmallVectorTemplateCommon<int,_void> local_178;
  uint local_158;
  SmallVectorTemplateCommon<tf::Node_*,_void> local_148;
  uint *local_120;
  uint *local_118;
  SmallVectorTemplateCommon<tf::Node_*,_void> *local_110;
  Node *local_100;
  undefined8 local_f8;
  undefined4 local_ec;
  undefined8 local_e8;
  Worker *local_e0;
  Node *local_d8;
  undefined8 local_d0;
  undefined4 local_c4;
  undefined8 local_c0;
  Worker *local_b8;
  long local_b0;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  uint *local_90;
  __atomic_base<unsigned_long> local_88;
  memory_order local_80;
  int local_7c;
  __atomic_base<unsigned_long> local_78;
  atomic<unsigned_long> *local_70;
  Node *local_68;
  uint **local_60;
  SmallVectorTemplateCommon<tf::Node_*,_void> *local_58;
  Executor *local_48;
  uint **local_40;
  SmallVectorTemplateCommon<tf::Node_*,_void> *local_38;
  __int_type_conflict local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined8 local_10;
  atomic<unsigned_long> *local_8;
  
  local_118 = in_RDX;
  local_110 = in_RSI;
LAB_0010b9cf:
  do {
    local_120 = (uint *)0x0;
    if ((*local_118 & 0x20000000) == 0) {
      bVar2 = Node::_is_cancelled((Node *)in_stack_fffffffffffffd50);
      if (bVar2) {
        in_RSI = local_110;
        _tear_down_invoke((Executor *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                          in_stack_fffffffffffffd78,(Node *)in_stack_fffffffffffffd70,
                          (Node **)in_stack_fffffffffffffd68);
        if (local_120 == (uint *)0x0) {
          return;
        }
        local_118 = local_120;
        goto LAB_0010b9cf;
      }
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                          *)0x10ba62);
      if (bVar2) {
        pSVar4 = std::unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>::
                 operator->((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                             *)0x10ba7f);
        bVar2 = SmallVectorBase::empty((SmallVectorBase *)pSVar4);
        if (!bVar2) {
          in_RSI = &local_148;
          SmallVector<tf::Node_*,_2U>::SmallVector((SmallVector<tf::Node_*,_2U> *)0x10baa4);
          bVar2 = Node::_acquire_all((Node *)in_stack_fffffffffffffd58,
                                     (SmallVector<tf::Node_*,_2U> *)in_stack_fffffffffffffd50);
          pSVar8 = local_110;
          if (!bVar2) {
            SmallVectorTemplateCommon<tf::Node_*,_void>::begin(&local_148);
            SmallVectorTemplateCommon<tf::Node_*,_void>::end(&local_148);
            _schedule<tf::Node**>
                      ((Executor *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       in_stack_fffffffffffffd78,(Node **)in_stack_fffffffffffffd70,
                       (Node **)in_stack_fffffffffffffd68);
            in_RSI = pSVar8;
          }
          local_158 = (uint)!bVar2;
          SmallVector<tf::Node_*,_2U>::~SmallVector((SmallVector<tf::Node_*,_2U> *)0x10bb83);
          if (local_158 != 0) {
            return;
          }
        }
      }
    }
    SmallVector<int,_2U>::SmallVector((SmallVector<int,_2U> *)0x10bba6);
    pcVar3 = std::
             variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             ::index((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      *)(local_118 + 0x22),(char *)in_RSI,__c);
    switch(pcVar3) {
    case (char *)0x1:
      in_RSI = local_110;
      _invoke_static_task(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          in_stack_fffffffffffffd40);
    default:
switchD_0010bbe5_default:
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                          *)0x10beb4);
      if (bVar2) {
        pSVar4 = std::unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>::
                 operator->((unique_ptr<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>
                             *)0x10bed1);
        bVar2 = SmallVectorBase::empty((SmallVectorBase *)&pSVar4->to_release);
        if (!bVar2) {
          SmallVector<tf::Node_*,_2U>::SmallVector((SmallVector<tf::Node_*,_2U> *)0x10bf04);
          Node::_release_all((Node *)in_stack_fffffffffffffd50,
                             (SmallVector<tf::Node_*,_2U> *)in_stack_fffffffffffffd48);
          in_RSI = local_110;
          SmallVectorTemplateCommon<tf::Node_*,_void>::begin(&local_1a0);
          SmallVectorTemplateCommon<tf::Node_*,_void>::end(&local_1a0);
          _schedule<tf::Node**>
                    ((Executor *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd78,(Node **)in_stack_fffffffffffffd70,
                     (Node **)in_stack_fffffffffffffd68);
          SmallVector<tf::Node_*,_2U>::~SmallVector((SmallVector<tf::Node_*,_2U> *)0x10bf8f);
        }
      }
      puVar5 = local_118 + 0x20;
      sVar6 = Node::num_predecessors((Node *)in_stack_fffffffffffffd30);
      uVar1 = *local_118;
      local_a8 = sVar6 - (uVar1 & 0xfffffff);
      local_9c = 0;
      LOCK();
      local_b0 = *(long *)puVar5;
      *(long *)puVar5 = *(long *)puVar5 + local_a8;
      UNLOCK();
      if (*(long *)(local_118 + 0xe) == 0) {
        local_260 = (Worker *)(*(long *)(local_118 + 0xc) + 0x60);
      }
      else {
        local_260 = (Worker *)(*(long *)(local_118 + 0xe) + 0x80);
      }
      local_98 = local_a8;
      local_90 = puVar5;
      pcVar3 = std::
               variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
               ::index((variant<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                        *)(local_118 + 0x22),(char *)in_RSI,uVar1 & 0xfffffff);
      if (pcVar3 + -4 < (char *)0x2) {
        local_1b8 = (Worker *)SmallVectorTemplateCommon<int,_void>::begin(&local_178);
        in_stack_fffffffffffffd98 = local_1b8;
        pWVar7 = (Worker *)SmallVectorTemplateCommon<int,_void>::end(&local_178);
        in_stack_fffffffffffffd90 = pWVar7;
        for (; local_1b8 != pWVar7; local_1b8 = (Worker *)&local_1b8->field_0x4) {
          if ((-1 < *(int *)local_1b8) &&
             ((ulong)(long)*(int *)local_1b8 < *(ulong *)(local_118 + 0x10))) {
            in_stack_fffffffffffffd88 =
                 (Node *)SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                                   ((SmallVectorTemplateCommon<tf::Node_*,_void> *)
                                    in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
            in_stack_fffffffffffffe30 = *(Executor **)in_stack_fffffffffffffd88;
            in_stack_fffffffffffffd78 = (Worker *)&in_stack_fffffffffffffe30->field_0x80;
            local_78._M_i = 0;
            local_7c = 0;
            in_stack_fffffffffffffd60 = in_RDI;
            local_70 = (atomic<unsigned_long> *)in_stack_fffffffffffffd78;
            local_80 = std::operator&(memory_order_relaxed,__memory_order_mask);
            local_88._M_i = local_78._M_i;
            if (local_7c == 3) {
              *(__int_type_conflict *)in_stack_fffffffffffffd78 = local_78._M_i;
            }
            else if (local_7c == 5) {
              LOCK();
              *(__int_type_conflict *)in_stack_fffffffffffffd78 = local_78._M_i;
              UNLOCK();
            }
            else {
              *(__int_type_conflict *)in_stack_fffffffffffffd78 = local_78._M_i;
            }
            local_b8 = local_260;
            local_c0 = 1;
            local_c4 = 0;
            local_d0 = 1;
            in_stack_fffffffffffffd70 = (Worker *)0xffffffff;
            LOCK();
            local_d8 = *(Node **)local_260;
            *(Node **)local_260 = (Node *)((long)&(*(Node **)local_260)->_nstate + 1);
            UNLOCK();
            local_38 = local_110;
            local_40 = &local_120;
            in_stack_fffffffffffffd68 = local_260;
            in_stack_fffffffffffffd84 = local_7c;
            in_RDI = in_stack_fffffffffffffd60;
            local_48 = in_stack_fffffffffffffe30;
            if (local_120 != (uint *)0x0) {
              _schedule(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
                        (Node *)in_stack_fffffffffffffd50);
            }
            *local_40 = (uint *)local_48;
          }
        }
      }
      else {
        for (in_stack_fffffffffffffe28 = (Worker *)0x0;
            in_stack_fffffffffffffe28 < *(Worker **)(local_118 + 0x10);
            in_stack_fffffffffffffe28 = (Worker *)&in_stack_fffffffffffffe28->field_0x1) {
          in_stack_fffffffffffffd58 =
               (Worker *)
               SmallVectorTemplateCommon<tf::Node_*,_void>::operator[]
                         ((SmallVectorTemplateCommon<tf::Node_*,_void> *)in_stack_fffffffffffffd30,
                          in_stack_fffffffffffffd28);
          in_stack_fffffffffffffe20 = *(Node **)in_stack_fffffffffffffd58;
          in_stack_fffffffffffffd48 = (Worker *)&in_stack_fffffffffffffe20->_join_counter;
          local_10 = 1;
          local_14 = 4;
          local_20 = 1;
          in_stack_fffffffffffffd50 = (Executor *)0x3;
          LOCK();
          local_28 = (((atomic<unsigned_long> *)in_stack_fffffffffffffd48)->
                     super___atomic_base<unsigned_long>)._M_i;
          (((atomic<unsigned_long> *)in_stack_fffffffffffffd48)->super___atomic_base<unsigned_long>)
          ._M_i = (((atomic<unsigned_long> *)in_stack_fffffffffffffd48)->
                  super___atomic_base<unsigned_long>)._M_i - 1;
          UNLOCK();
          local_8 = (atomic<unsigned_long> *)in_stack_fffffffffffffd48;
          if (local_28 == 1) {
            local_e0 = local_260;
            local_e8 = 1;
            local_ec = 0;
            local_f8 = 1;
            in_stack_fffffffffffffd40 = (Node *)0xffffffff;
            LOCK();
            local_100 = *(Node **)local_260;
            *(Node **)local_260 = (Node *)((long)&(*(Node **)local_260)->_nstate + 1);
            UNLOCK();
            local_58 = local_110;
            local_60 = &local_120;
            in_stack_fffffffffffffd30 = in_RDI;
            local_68 = in_stack_fffffffffffffe20;
            if (local_120 != (uint *)0x0) {
              pEVar9 = in_RDI;
              _schedule(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(Node *)0x3);
              in_stack_fffffffffffffd30 = in_RDI;
              in_RDI = pEVar9;
            }
            *local_60 = (uint *)local_68;
          }
        }
      }
      in_RSI = local_110;
      _tear_down_invoke((Executor *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                        in_stack_fffffffffffffd78,(Node *)in_stack_fffffffffffffd70,
                        (Node **)in_stack_fffffffffffffd68);
      if (local_120 == (uint *)0x0) {
        local_158 = 0;
      }
      else {
        local_118 = local_120;
        local_158 = 2;
      }
      break;
    case (char *)0x2:
      in_RSI = local_110;
      bVar2 = _invoke_runtime_task
                        (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         in_stack_fffffffffffffd40);
      if (!bVar2) goto switchD_0010bbe5_default;
      local_158 = 1;
      break;
    case (char *)0x3:
      in_RSI = local_110;
      bVar2 = _invoke_subflow_task
                        ((Executor *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                         in_stack_fffffffffffffd88);
      if (!bVar2) goto switchD_0010bbe5_default;
      local_158 = 1;
      break;
    case (char *)0x4:
      in_RSI = local_110;
      _invoke_condition_task
                ((Executor *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                 (Node *)in_stack_fffffffffffffd60,(SmallVector<int,_2U> *)in_stack_fffffffffffffd58
                );
      goto switchD_0010bbe5_default;
    case (char *)0x5:
      in_RSI = local_110;
      _invoke_multi_condition_task
                ((Executor *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                 (Node *)in_stack_fffffffffffffd60,(SmallVector<int,_2U> *)in_stack_fffffffffffffd58
                );
      goto switchD_0010bbe5_default;
    case (char *)0x6:
      in_RSI = local_110;
      bVar2 = _invoke_module_task(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                                  in_stack_fffffffffffffd40);
      if (!bVar2) goto switchD_0010bbe5_default;
      local_158 = 1;
      break;
    case (char *)0x7:
      in_RSI = local_110;
      bVar2 = _invoke_async_task((Executor *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                                 (Node *)in_stack_fffffffffffffd68);
      if (bVar2) {
        local_158 = 1;
      }
      else {
        in_RSI = local_110;
        _tear_down_async((Executor *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                         (Node *)in_stack_fffffffffffffd60,(Node **)in_stack_fffffffffffffd58);
        if (local_120 == (uint *)0x0) {
          local_158 = 1;
        }
        else {
          local_118 = local_120;
          local_158 = 2;
        }
      }
      break;
    case (char *)0x8:
      in_RSI = local_110;
      bVar2 = _invoke_dependent_async_task
                        ((Executor *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                         (Node *)in_stack_fffffffffffffd68);
      if (bVar2) {
        local_158 = 1;
      }
      else {
        in_RSI = local_110;
        _tear_down_dependent_async
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                   (Node **)in_RDI);
        if (local_120 == (uint *)0x0) {
          local_158 = 1;
        }
        else {
          local_118 = local_120;
          local_158 = 2;
        }
      }
    }
    SmallVector<int,_2U>::~SmallVector((SmallVector<int,_2U> *)0x10c81a);
    if (local_158 < 2) {
      return;
    }
  } while( true );
}

Assistant:

inline void Executor::_invoke(Worker& worker, Node* node) {

  #define TF_INVOKE_CONTINUATION()  \
  if (cache) {                      \
    node = cache;                   \
    goto begin_invoke;              \
  }

  begin_invoke:

  Node* cache {nullptr};
  
  // if this is the second invoke due to preemption, directly jump to invoke task
  if(node->_nstate & NSTATE::PREEMPTED) {
    goto invoke_task;
  }

  // if the work has been cancelled, there is no need to continue
  if(node->_is_cancelled()) {
    _tear_down_invoke(worker, node, cache);
    TF_INVOKE_CONTINUATION();
    return;
  }

  // if acquiring semaphore(s) exists, acquire them first
  if(node->_semaphores && !node->_semaphores->to_acquire.empty()) {
    SmallVector<Node*> waiters;
    if(!node->_acquire_all(waiters)) {
      _schedule(worker, waiters.begin(), waiters.end());
      return;
    }
  }
  
  invoke_task:
  
  SmallVector<int> conds;

  // switch is faster than nested if-else due to jump table
  switch(node->_handle.index()) {
    // static task
    case Node::STATIC:{
      _invoke_static_task(worker, node);
    }
    break;
    
    // runtime task
    case Node::RUNTIME:{
      if(_invoke_runtime_task(worker, node)) {
        return;
      }
    }
    break;

    // subflow task
    case Node::SUBFLOW: {
      if(_invoke_subflow_task(worker, node)) {
        return;
      }
    }
    break;

    // condition task
    case Node::CONDITION: {
      _invoke_condition_task(worker, node, conds);
    }
    break;

    // multi-condition task
    case Node::MULTI_CONDITION: {
      _invoke_multi_condition_task(worker, node, conds);
    }
    break;

    // module task
    case Node::MODULE: {
      if(_invoke_module_task(worker, node)) {
        return;
      }
    }
    break;

    // async task
    case Node::ASYNC: {
      if(_invoke_async_task(worker, node)) {
        return;
      }
      _tear_down_async(worker, node, cache);
      TF_INVOKE_CONTINUATION();
      return;
    }
    break;

    // dependent async task
    case Node::DEPENDENT_ASYNC: {
      if(_invoke_dependent_async_task(worker, node)) {
        return;
      }
      _tear_down_dependent_async(worker, node, cache);
      TF_INVOKE_CONTINUATION();
      return;
    }
    break;

    // monostate (placeholder)
    default:
    break;
  }

  // if releasing semaphores exist, release them
  if(node->_semaphores && !node->_semaphores->to_release.empty()) {
    SmallVector<Node*> waiters;
    node->_release_all(waiters);
    _schedule(worker, waiters.begin(), waiters.end());
  }

  // Reset the join counter with strong dependencies to support cycles.
  // + We must do this before scheduling the successors to avoid race
  //   condition on _predecessors.
  // + We must use fetch_add instead of direct assigning
  //   because the user-space call on "invoke" may explicitly schedule 
  //   this task again (e.g., pipeline) which can access the join_counter.
  node->_join_counter.fetch_add(
    node->num_predecessors() - (node->_nstate & ~NSTATE::MASK), std::memory_order_relaxed
  );

  // acquire the parent flow counter
  auto& join_counter = (node->_parent) ? node->_parent->_join_counter :
                       node->_topology->_join_counter;

  // Invoke the task based on the corresponding type
  switch(node->_handle.index()) {

    // condition and multi-condition tasks
    case Node::CONDITION:
    case Node::MULTI_CONDITION: {
      for(auto cond : conds) {
        if(cond >= 0 && static_cast<size_t>(cond) < node->_num_successors) {
          auto s = node->_edges[cond]; 
          // zeroing the join counter for invariant
          s->_join_counter.store(0, std::memory_order_relaxed);
          join_counter.fetch_add(1, std::memory_order_relaxed);
          _update_cache(worker, cache, s);
        }
      }
    }
    break;

    // non-condition task
    default: {
      for(size_t i=0; i<node->_num_successors; ++i) {
        //if(auto s = node->_successors[i]; --(s->_join_counter) == 0) {
        if(auto s = node->_edges[i]; s->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
          join_counter.fetch_add(1, std::memory_order_relaxed);
          _update_cache(worker, cache, s);
        }
      }
    }
    break;
  }
  
  // clean up the node after execution
  _tear_down_invoke(worker, node, cache);
  TF_INVOKE_CONTINUATION();
}